

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_frame.cpp
# Opt level: O0

RK_U32 mpp_frame_get_fbc_offset(MppFrame frame)

{
  MPP_RET MVar1;
  uint local_28;
  RK_U32 fbc_offset;
  RK_U32 fbc_version;
  MppFrameImpl *p;
  MppFrame frame_local;
  
  MVar1 = _check_is_mpp_frame("mpp_frame_get_fbc_offset",frame);
  if (MVar1 == MPP_OK) {
    if ((*(uint *)((long)frame + 0x68) & 0xf00000) != 0) {
      if ((*(uint *)((long)frame + 0x68) & 0xf00000) == 0x100000) {
        local_28 = ((*(int *)((long)frame + 8) + 0xfU & 0xfffffff0) *
                    (*(int *)((long)frame + 0xc) + 0xfU & 0xfffffff0) >> 4) + 0xfff & 0xfffff000;
      }
      else {
        local_28 = 0;
      }
      *(uint *)((long)frame + 0xc0) = local_28;
    }
    frame_local._4_4_ = *(RK_U32 *)((long)frame + 0xc0);
  }
  else {
    frame_local._4_4_ = 0;
  }
  return frame_local._4_4_;
}

Assistant:

RK_U32 mpp_frame_get_fbc_offset(MppFrame frame)
{
    if (check_is_mpp_frame(frame))
        return 0;

    MppFrameImpl *p = (MppFrameImpl *)frame;

    if (MPP_FRAME_FMT_IS_FBC(p->fmt)) {
        RK_U32 fbc_version = p->fmt & MPP_FRAME_FBC_MASK;
        RK_U32 fbc_offset = 0;

        if (fbc_version == MPP_FRAME_FBC_AFBC_V1) {
            fbc_offset = MPP_ALIGN(MPP_ALIGN(p->width, 16) *
                                   MPP_ALIGN(p->height, 16) / 16, SZ_4K);
        } else if (fbc_version == MPP_FRAME_FBC_AFBC_V2 ||
                   fbc_version == MPP_FRAME_FBC_RKFBC) {
            fbc_offset = 0;
        }
        p->fbc_offset = fbc_offset;
    }

    return p->fbc_offset;
}